

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O3

uint __thiscall Js::StepController::GetScriptId(StepController *this,FunctionBody *body)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Utf8SourceInfo *pUVar5;
  
  if (body == (FunctionBody *)0x0) {
    uVar3 = 0;
  }
  else {
    pUVar5 = (body->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    if (pUVar5 == (Utf8SourceInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                                  ,0x156,"(body->GetUtf8SourceInfo() != nullptr)",
                                  "body->GetUtf8SourceInfo() == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      pUVar5 = (body->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    }
    uVar3 = pUVar5->m_sourceInfoId;
  }
  return uVar3;
}

Assistant:

uint StepController::GetScriptId(_In_ FunctionBody* body)
    {
        // safe value
        uint retValue = BuiltInFunctionsScriptId;

        if (body != nullptr)
        {
            // FYI - Different script blocks within a HTML page will have different source Info ids even though they have the same backing file.
            // It might imply we notify the debugger a bit more than needed - thus can be TODO for performance improvements of the Just-My-Code
            // or step to next document boundary mode.
            AssertMsg(body->GetUtf8SourceInfo() != nullptr, "body->GetUtf8SourceInfo() == nullptr");
            retValue = body->GetUtf8SourceInfo()->GetSourceInfoId();
        }

        return retValue;
    }